

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O2

void __thiscall SQCompilation::CheckerVisitor::checkAssertCall(CheckerVisitor *this,CallExpr *call)

{
  int iVar1;
  Expr *pEVar2;
  
  pEVar2 = maybeEval(this,call->_callee,false);
  if ((pEVar2->super_Node)._op == TO_ID) {
    iVar1 = strcmp("assert",(char *)pEVar2[1].super_Node.super_ArenaObj._vptr_ArenaObj);
    if ((iVar1 == 0) && (0xfffffffd < (call->_args)._size - 3)) {
      speculateIfConditionHeuristics
                (this,*(call->_args)._vals,this->currentScope,(VarScope *)0x0,false);
      return;
    }
  }
  return;
}

Assistant:

void CheckerVisitor::checkAssertCall(const CallExpr *call) {

  // assert(x != null) or assert(x != null, "X should not be null")

  const Expr *callee = maybeEval(call->callee());

  if (callee->op() != TO_ID)
    return;

  if (strcmp("assert", callee->asId()->id()) != 0)
    return;


  const SQUnsignedInteger argSize = call->arguments().size();

  if (!argSize || argSize > 2)
    return;

  const Expr *cond = call->arguments()[0];

  speculateIfConditionHeuristics(cond, currentScope, nullptr);
}